

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composite_base_test.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_33210::Composite::~Composite(Composite *this)

{
  void *in_RDI;
  
  ~Composite((Composite *)0x14d118);
  operator_delete(in_RDI);
  return;
}

Assistant:

int get() const override {
    auto sum = 0;
    for (const auto &x : m_items) {
      sum += x->get();
    }
    return sum;
  }